

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O0

FT_Fixed cff_parse_real(FT_Byte *start,FT_Byte *limit,FT_Long power_ten,FT_Long *scaling)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  long local_90;
  FT_Long shift;
  FT_Long new_fraction_length;
  FT_Long fraction_length;
  FT_Long integer_length;
  FT_Long exponent_add;
  FT_Int have_overflow;
  FT_Int exponent_sign;
  FT_Int sign;
  FT_Long exponent;
  FT_Long number;
  FT_Long result;
  FT_UInt phase;
  FT_Int nib;
  FT_Byte *p;
  FT_Long *scaling_local;
  FT_Long power_ten_local;
  FT_Byte *limit_local;
  FT_Byte *start_local;
  
  bVar2 = false;
  bVar1 = false;
  if (scaling != (FT_Long *)0x0) {
    *scaling = 0;
  }
  number = 0;
  exponent = 0;
  _exponent_sign = 0;
  integer_length = 0;
  fraction_length = 0;
  new_fraction_length = 0;
  result._0_4_ = 4;
  _phase = start;
  while( true ) {
    while( true ) {
      if (((int)result != 0) && (_phase = _phase + 1, limit <= _phase)) goto LAB_0015af58;
      result._4_4_ = (int)(uint)*_phase >> ((byte)(int)result & 0x1f) & 0xf;
      result._0_4_ = 4 - (int)result;
      if (result._4_4_ != 0xe) break;
      bVar2 = true;
    }
    if (9 < result._4_4_) break;
    if (exponent < 0xccccccc) {
      if ((result._4_4_ != 0) || (exponent != 0)) {
        fraction_length = fraction_length + 1;
        exponent = exponent * 10 + (long)(int)result._4_4_;
      }
    }
    else {
      integer_length = integer_length + 1;
    }
  }
  if (result._4_4_ == 10) {
    while( true ) {
      if (((int)result != 0) && (_phase = _phase + 1, limit <= _phase)) goto LAB_0015af58;
      result._4_4_ = (int)(uint)*_phase >> ((byte)(int)result & 0x1f) & 0xf;
      result._0_4_ = 4 - (int)result;
      if (9 < result._4_4_) break;
      if ((result._4_4_ == 0) && (exponent == 0)) {
        integer_length = integer_length + -1;
      }
      else if ((exponent < 0xccccccc) && (new_fraction_length < 9)) {
        new_fraction_length = new_fraction_length + 1;
        exponent = exponent * 10 + (long)(int)result._4_4_;
      }
    }
  }
  bVar5 = result._4_4_ == 0xc;
  if (bVar5) {
    result._4_4_ = 0xb;
  }
  if (result._4_4_ == 0xb) {
    while( true ) {
      if (((int)result != 0) && (_phase = _phase + 1, limit <= _phase)) goto LAB_0015af58;
      uVar3 = (int)(uint)*_phase >> ((byte)(int)result & 0x1f) & 0xf;
      result._0_4_ = 4 - (int)result;
      if (9 < uVar3) break;
      if (_exponent_sign < 0x3e9) {
        _exponent_sign = _exponent_sign * 10 + (long)(int)uVar3;
      }
      else {
        bVar1 = true;
      }
    }
    if (bVar5) {
      _exponent_sign = -_exponent_sign;
    }
  }
  if (exponent == 0) goto LAB_0015af23;
  if (bVar1) {
    if (bVar5) {
LAB_0015af4c:
      number = 0;
      goto LAB_0015af23;
    }
  }
  else {
    _exponent_sign = power_ten + integer_length + _exponent_sign;
    if (scaling != (FT_Long *)0x0) {
      lVar4 = fraction_length + new_fraction_length;
      _exponent_sign = fraction_length + _exponent_sign;
      if (lVar4 < 6) {
        if (exponent < 0x8000) {
          if (_exponent_sign < 1) {
            _exponent_sign = _exponent_sign - lVar4;
          }
          else {
            local_90 = _exponent_sign;
            if (4 < _exponent_sign) {
              local_90 = 5;
            }
            if (local_90 - lVar4 < 1) {
              _exponent_sign = _exponent_sign - lVar4;
            }
            else {
              _exponent_sign = _exponent_sign - local_90;
              exponent = power_tens[local_90 - lVar4] * exponent;
              if (0x7fff < exponent) {
                exponent = exponent / 10;
                _exponent_sign = _exponent_sign + 1;
              }
            }
          }
          number = exponent << 0x10;
          *scaling = _exponent_sign;
        }
        else {
          number = FT_DivFix(exponent,10);
          *scaling = (_exponent_sign - lVar4) + 1;
        }
      }
      else if (exponent / power_tens[lVar4 + -5] < 0x8000) {
        number = FT_DivFix(exponent,power_tens[lVar4 + -5]);
        *scaling = _exponent_sign + -5;
      }
      else {
        number = FT_DivFix(exponent,power_tens[lVar4 + -4]);
        *scaling = _exponent_sign + -4;
      }
      goto LAB_0015af23;
    }
    lVar4 = _exponent_sign + fraction_length;
    new_fraction_length = new_fraction_length - _exponent_sign;
    if (lVar4 < 6) {
      if (lVar4 < -5) goto LAB_0015af4c;
      if (lVar4 < 0) {
        exponent = exponent / power_tens[-lVar4];
        new_fraction_length = lVar4 + new_fraction_length;
      }
      if (new_fraction_length == 10) {
        exponent = exponent / 10;
        new_fraction_length = 9;
      }
      if (0 < new_fraction_length) {
        if (exponent / power_tens[new_fraction_length] < 0x8000) {
          number = FT_DivFix(exponent,power_tens[new_fraction_length]);
        }
        goto LAB_0015af23;
      }
      if (power_tens[-new_fraction_length] * exponent < 0x8000) {
        number = power_tens[-new_fraction_length] * exponent * 0x10000;
        goto LAB_0015af23;
      }
    }
  }
  number = 0x7fffffff;
LAB_0015af23:
  if (bVar2) {
    number = -number;
  }
  return number;
LAB_0015af58:
  number = 0;
  goto LAB_0015af23;
}

Assistant:

static FT_Fixed
  cff_parse_real( FT_Byte*  start,
                  FT_Byte*  limit,
                  FT_Long   power_ten,
                  FT_Long*  scaling )
  {
    FT_Byte*  p = start;
    FT_Int    nib;
    FT_UInt   phase;

    FT_Long   result, number, exponent;
    FT_Int    sign = 0, exponent_sign = 0, have_overflow = 0;
    FT_Long   exponent_add, integer_length, fraction_length;


    if ( scaling )
      *scaling = 0;

    result = 0;

    number   = 0;
    exponent = 0;

    exponent_add    = 0;
    integer_length  = 0;
    fraction_length = 0;

    /* First of all, read the integer part. */
    phase = 4;

    for (;;)
    {
      /* If we entered this iteration with phase == 4, we need to */
      /* read a new byte.  This also skips past the initial 0x1E. */
      if ( phase )
      {
        p++;

        /* Make sure we don't read past the end. */
        if ( p >= limit )
          goto Bad;
      }

      /* Get the nibble. */
      nib   = (FT_Int)( p[0] >> phase ) & 0xF;
      phase = 4 - phase;

      if ( nib == 0xE )
        sign = 1;
      else if ( nib > 9 )
        break;
      else
      {
        /* Increase exponent if we can't add the digit. */
        if ( number >= 0xCCCCCCCL )
          exponent_add++;
        /* Skip leading zeros. */
        else if ( nib || number )
        {
          integer_length++;
          number = number * 10 + nib;
        }
      }
    }

    /* Read fraction part, if any. */
    if ( nib == 0xA )
      for (;;)
      {
        /* If we entered this iteration with phase == 4, we need */
        /* to read a new byte.                                   */
        if ( phase )
        {
          p++;

          /* Make sure we don't read past the end. */
          if ( p >= limit )
            goto Bad;
        }

        /* Get the nibble. */
        nib   = ( p[0] >> phase ) & 0xF;
        phase = 4 - phase;
        if ( nib >= 10 )
          break;

        /* Skip leading zeros if possible. */
        if ( !nib && !number )
          exponent_add--;
        /* Only add digit if we don't overflow. */
        else if ( number < 0xCCCCCCCL && fraction_length < 9 )
        {
          fraction_length++;
          number = number * 10 + nib;
        }
      }

    /* Read exponent, if any. */
    if ( nib == 12 )
    {
      exponent_sign = 1;
      nib           = 11;
    }

    if ( nib == 11 )
    {
      for (;;)
      {
        /* If we entered this iteration with phase == 4, */
        /* we need to read a new byte.                   */
        if ( phase )
        {
          p++;

          /* Make sure we don't read past the end. */
          if ( p >= limit )
            goto Bad;
        }

        /* Get the nibble. */
        nib   = ( p[0] >> phase ) & 0xF;
        phase = 4 - phase;
        if ( nib >= 10 )
          break;

        /* Arbitrarily limit exponent. */
        if ( exponent > 1000 )
          have_overflow = 1;
        else
          exponent = exponent * 10 + nib;
      }

      if ( exponent_sign )
        exponent = -exponent;
    }

    if ( !number )
      goto Exit;

    if ( have_overflow )
    {
      if ( exponent_sign )
        goto Underflow;
      else
        goto Overflow;
    }

    /* We don't check `power_ten' and `exponent_add'. */
    exponent += power_ten + exponent_add;

    if ( scaling )
    {
      /* Only use `fraction_length'. */
      fraction_length += integer_length;
      exponent        += integer_length;

      if ( fraction_length <= 5 )
      {
        if ( number > 0x7FFFL )
        {
          result   = FT_DivFix( number, 10 );
          *scaling = exponent - fraction_length + 1;
        }
        else
        {
          if ( exponent > 0 )
          {
            FT_Long  new_fraction_length, shift;


            /* Make `scaling' as small as possible. */
            new_fraction_length = FT_MIN( exponent, 5 );
            shift               = new_fraction_length - fraction_length;

            if ( shift > 0 )
            {
              exponent -= new_fraction_length;
              number   *= power_tens[shift];
              if ( number > 0x7FFFL )
              {
                number   /= 10;
                exponent += 1;
              }
            }
            else
              exponent -= fraction_length;
          }
          else
            exponent -= fraction_length;

          result   = (FT_Long)( (FT_ULong)number << 16 );
          *scaling = exponent;
        }
      }
      else
      {
        if ( ( number / power_tens[fraction_length - 5] ) > 0x7FFFL )
        {
          result   = FT_DivFix( number, power_tens[fraction_length - 4] );
          *scaling = exponent - 4;
        }
        else
        {
          result   = FT_DivFix( number, power_tens[fraction_length - 5] );
          *scaling = exponent - 5;
        }
      }
    }
    else
    {
      integer_length  += exponent;
      fraction_length -= exponent;

      if ( integer_length > 5 )
        goto Overflow;
      if ( integer_length < -5 )
        goto Underflow;

      /* Remove non-significant digits. */
      if ( integer_length < 0 )
      {
        number          /= power_tens[-integer_length];
        fraction_length += integer_length;
      }

      /* this can only happen if exponent was non-zero */
      if ( fraction_length == 10 )
      {
        number          /= 10;
        fraction_length -= 1;
      }

      /* Convert into 16.16 format. */
      if ( fraction_length > 0 )
      {
        if ( ( number / power_tens[fraction_length] ) > 0x7FFFL )
          goto Exit;

        result = FT_DivFix( number, power_tens[fraction_length] );
      }
      else
      {
        number *= power_tens[-fraction_length];

        if ( number > 0x7FFFL )
          goto Overflow;

        result = (FT_Long)( (FT_ULong)number << 16 );
      }
    }

  Exit:
    if ( sign )
      result = -result;

    return result;

  Overflow:
    result = 0x7FFFFFFFL;
    FT_TRACE4(( "!!!OVERFLOW:!!!" ));
    goto Exit;

  Underflow:
    result = 0;
    FT_TRACE4(( "!!!UNDERFLOW:!!!" ));
    goto Exit;

  Bad:
    result = 0;
    FT_TRACE4(( "!!!END OF DATA:!!!" ));
    goto Exit;
  }